

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# files.cpp
# Opt level: O0

long __thiscall MemoryArrayReader::Read(MemoryArrayReader *this,void *buffer,long len)

{
  uchar *__src;
  size_t local_20;
  long len_local;
  void *buffer_local;
  MemoryArrayReader *this_local;
  
  local_20 = len;
  if ((this->super_FileReader).Length - (this->super_FileReader).FilePos < len) {
    local_20 = (this->super_FileReader).Length - (this->super_FileReader).FilePos;
  }
  if ((long)local_20 < 0) {
    local_20 = 0;
  }
  __src = TArray<unsigned_char,_unsigned_char>::operator[]
                    (&this->buf,(this->super_FileReader).FilePos);
  memcpy(buffer,__src,local_20);
  (this->super_FileReader).FilePos = local_20 + (this->super_FileReader).FilePos;
  return local_20;
}

Assistant:

long MemoryArrayReader::Read (void *buffer, long len)
{
    if (len>Length-FilePos) len=Length-FilePos;
    if (len<0) len=0;
    memcpy(buffer,&buf[FilePos],len);
    FilePos+=len;
    return len;
}